

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O1

Fl_Tree_Item * __thiscall Fl_Tree::last_visible_item(Fl_Tree *this)

{
  int iVar1;
  Fl_Tree_Item *this_00;
  Fl_Tree_Item *pFVar2;
  
  this_00 = this->_root;
  if (this_00 == (Fl_Tree_Item *)0x0) {
    this_00 = (Fl_Tree_Item *)0x0;
  }
  else {
    for (; iVar1 = (this_00->_children)._total, iVar1 != 0;
        this_00 = (this_00->_children)._items[(long)iVar1 + -1]) {
    }
  }
  while( true ) {
    if (this_00 == (Fl_Tree_Item *)0x0) {
      return (Fl_Tree_Item *)0x0;
    }
    if (this_00->_visible != '\0') break;
    this_00 = Fl_Tree_Item::prev(this_00);
  }
  pFVar2 = (Fl_Tree_Item *)0x0;
  if ((this->_prefs)._showroot != '\0') {
    pFVar2 = this_00;
  }
  if (this_00 != this->_root) {
    return this_00;
  }
  return pFVar2;
}

Assistant:

Fl_Tree_Item* Fl_Tree::last_visible_item() {
  Fl_Tree_Item *item = last();
  while ( item ) {
    if ( item->visible() ) {
      if ( item == _root && !showroot() ) {
        return(0);
      } else {
        return(item);
      }
    }
    item = prev(item);
  }
  return(item);
}